

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCopier::Parse(cmFileCopier *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  char *__s;
  cmCommand *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t sVar6;
  pointer pbVar7;
  ulong uVar8;
  bool bVar9;
  ostringstream e;
  undefined1 auStack_1c8 [8];
  string local_1c0;
  undefined1 local_1a0 [376];
  
  this->Doing = 3;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar9 = 0x20 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7);
  if (bVar9) {
    uVar4 = 1;
    uVar8 = 2;
    do {
      iVar3 = (*this->_vptr_cmFileCopier[7])(this,pbVar7 + uVar4);
      if (((char)iVar3 == '\0') &&
         (iVar3 = (*this->_vptr_cmFileCopier[8])
                            (this,(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar4),
         (char)iVar3 == '\0')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"called with unknown argument \"",0x1e);
        pbVar7 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,pbVar7[uVar4]._M_dataplus._M_p,
                            pbVar7[uVar4]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
        pcVar1 = &this->FileCommand->super_cmCommand;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar1,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
LAB_002fe1b1:
        if (bVar9) goto LAB_002fe2b4;
        break;
      }
      if (this->Doing == 1) goto LAB_002fe1b1;
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5;
      bVar9 = uVar8 < uVar4;
      bVar2 = uVar8 < uVar4;
      uVar4 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
  }
  if ((this->Destination)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    __s = this->Name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)(auStack_1c8 + (long)*(_func_int **)(local_1a0._0_8_ + -0x18)) + 0x28);
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," given no DESTINATION",0x15);
    pcVar1 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar1,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
LAB_002fe2b4:
    bVar9 = false;
  }
  else {
    if ((this->UseGivenPermissionsFile == false) && (this->UseSourcePermissions == false)) {
      (*this->_vptr_cmFileCopier[9])(this);
    }
    bVar9 = true;
    if ((this->UseGivenPermissionsDir == false) && (this->UseSourcePermissions == false)) {
      (*this->_vptr_cmFileCopier[10])(this);
    }
  }
  return bVar9;
}

Assistant:

bool cmFileCopier::Parse(std::vector<std::string> const& args)
{
  this->Doing = DoingFiles;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    // Check this argument.
    if(!this->CheckKeyword(args[i]) &&
       !this->CheckValue(args[i]))
      {
      std::ostringstream e;
      e << "called with unknown argument \"" << args[i] << "\".";
      this->FileCommand->SetError(e.str());
      return false;
      }

    // Quit if an argument is invalid.
    if(this->Doing == DoingError)
      {
      return false;
      }
    }

  // Require a destination.
  if(this->Destination.empty())
    {
    std::ostringstream e;
    e << this->Name << " given no DESTINATION";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // If file permissions were not specified set default permissions.
  if(!this->UseGivenPermissionsFile && !this->UseSourcePermissions)
    {
    this->DefaultFilePermissions();
    }

  // If directory permissions were not specified set default permissions.
  if(!this->UseGivenPermissionsDir && !this->UseSourcePermissions)
    {
    this->DefaultDirectoryPermissions();
    }

  return true;
}